

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int IoCommandWriteBench(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  
  Extra_UtilGetoptReset();
  bVar1 = true;
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"lh");
    if (iVar2 != 0x6c) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (iVar2 == -1) {
    pAVar3 = pAbc->pNtkCur;
    if (pAVar3 == (Abc_Ntk_t *)0x0) {
      fwrite("Empty network.\n",0xf,1,(FILE *)pAbc->Out);
    }
    else {
      if (globalUtilOptind + 1 != argc) goto LAB_00327fdb;
      pcVar4 = argv[globalUtilOptind];
      if (bVar1) {
        pAVar3 = Abc_NtkToNetlist(pAVar3);
        Abc_NtkToAig(pAVar3);
        Io_WriteBenchLut(pAVar3,pcVar4);
        Abc_NtkDelete(pAVar3);
      }
      else {
        Io_Write(pAVar3,pcVar4,IO_FILE_BENCH);
      }
    }
    iVar2 = 0;
  }
  else {
LAB_00327fdb:
    fwrite("usage: write_bench [-lh] <file>\n",0x20,1,(FILE *)pAbc->Err);
    fwrite("\t         writes the network in BENCH format\n",0x2d,1,(FILE *)pAbc->Err);
    pcVar4 = "yes";
    if (!bVar1) {
      pcVar4 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-l     : toggle using LUTs in the output [default = %s]\n",pcVar4);
    fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\tfile   : the name of the file to write (extension .bench)\n",0x3b,1,(FILE *)pAbc->Err)
    ;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int IoCommandWriteBench( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    int fUseLuts;
    int c;

    fUseLuts = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'l':
                fUseLuts ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the corresponding file writer
    if ( !fUseLuts )
        Io_Write( pAbc->pNtkCur, pFileName, IO_FILE_BENCH );
    else if ( pAbc->pNtkCur )
    {
        Abc_Ntk_t * pNtkTemp;
        pNtkTemp = Abc_NtkToNetlist( pAbc->pNtkCur );
        Abc_NtkToAig( pNtkTemp );
        Io_WriteBenchLut( pNtkTemp, pFileName );
        Abc_NtkDelete( pNtkTemp );
    }
    else
        printf( "There is no current network.\n" );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_bench [-lh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the network in BENCH format\n" );
    fprintf( pAbc->Err, "\t-l     : toggle using LUTs in the output [default = %s]\n", fUseLuts? "yes" : "no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write (extension .bench)\n" );
    return 1;
}